

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaAttDefList.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::SchemaAttDefList::serialize(SchemaAttDefList *this,XSerializeEngine *serEng)

{
  RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> *toEnum;
  XMLSize_t XVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  MemoryManager *pMVar5;
  RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XSerializeEngine *serEng_local;
  SchemaAttDefList *this_local;
  
  XMLAttDefList::serialize(&this->super_XMLAttDefList,serEng);
  bVar2 = XSerializeEngine::isStoring(serEng);
  if (bVar2) {
    XTemplateSerializer::storeObject(this->fList,serEng);
    XSerializeEngine::writeSize(serEng,this->fCount);
  }
  else {
    XTemplateSerializer::loadObject(&this->fList,0x1d,true,serEng);
    XSerializeEngine::readSize(serEng,&this->fSize);
    if ((this->fEnum ==
         (RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> *)0x0)
       && (this->fList !=
           (RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> *)0x0)) {
      pMVar5 = XMLAttDefList::getMemoryManager(&this->super_XMLAttDefList);
      this_00 = (RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>
                 *)XMemory::operator_new(0x38,pMVar5);
      toEnum = this->fList;
      pMVar5 = XMLAttDefList::getMemoryManager(&this->super_XMLAttDefList);
      RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::
      RefHash2KeysTableOfEnumerator(this_00,toEnum,false,pMVar5);
      this->fEnum = this_00;
    }
    if (this->fSize != 0) {
      pMVar5 = XMLAttDefList::getMemoryManager(&this->super_XMLAttDefList);
      (*pMVar5->_vptr_MemoryManager[4])(pMVar5,this->fArray);
      pMVar5 = XMLAttDefList::getMemoryManager(&this->super_XMLAttDefList);
      iVar3 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,this->fSize << 3);
      this->fArray = (SchemaAttDef **)CONCAT44(extraout_var,iVar3);
      this->fCount = 0;
      while (uVar4 = (*(this->fEnum->super_XMLEnumerator<xercesc_4_0::SchemaAttDef>).
                       _vptr_XMLEnumerator[2])(), (uVar4 & 1) != 0) {
        iVar3 = (*(this->fEnum->super_XMLEnumerator<xercesc_4_0::SchemaAttDef>)._vptr_XMLEnumerator
                  [3])();
        XVar1 = this->fCount;
        this->fCount = XVar1 + 1;
        this->fArray[XVar1] = (SchemaAttDef *)CONCAT44(extraout_var_00,iVar3);
      }
    }
  }
  return;
}

Assistant:

void SchemaAttDefList::serialize(XSerializeEngine& serEng)
{

    XMLAttDefList::serialize(serEng);

    if (serEng.isStoring())
    {
        /***
         *
         * Serialize RefHash2KeysTableOf<SchemaAttDef>
         *
         ***/
        XTemplateSerializer::storeObject(fList, serEng);
        serEng.writeSize (fCount);

        // do not serialize fEnum
    }
    else
    {
        /***
         *
         * Deserialize RefHash2KeysTableOf<SchemaAttDef>
         *
         ***/
        XTemplateSerializer::loadObject(&fList, 29, true, serEng);

        // assume empty so we can size fArray just right
        serEng.readSize (fSize);
        if (!fEnum && fList)
        {
            fEnum = new (getMemoryManager()) RefHash2KeysTableOfEnumerator<SchemaAttDef>(fList, false, getMemoryManager());
        }
        if(fSize)
        {
            (getMemoryManager())->deallocate(fArray);
            fArray = (SchemaAttDef **)((getMemoryManager())->allocate( sizeof(SchemaAttDef*) * fSize));
            fCount = 0;
            while(fEnum->hasMoreElements())
            {
                fArray[fCount++] = &fEnum->nextElement();
            }
        }
    }

}